

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *color,
           LodePNGEncoderSettings *settings)

{
  size_t length;
  byte bVar1;
  uchar filterType;
  LodePNGColorType colortype;
  undefined4 uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  LodePNGFilterStrategy LVar16;
  uchar *puVar17;
  long lVar18;
  uint uVar19;
  uchar *puVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  uchar *dummy;
  size_t size [5];
  uchar *attempt_1 [5];
  uchar *attempt [5];
  uchar *local_4f8;
  ulong local_4e0;
  uchar *local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong auStack_498 [6];
  long alStack_468 [6];
  LodePNGCompressSettings local_438 [21];
  
  colortype = color->colortype;
  uVar5 = color->bitdepth;
  uVar4 = getNumColorChannels(colortype);
  uVar4 = uVar4 * uVar5;
  LVar16 = settings->filter_strategy;
  if (uVar5 < 8) {
    LVar16 = LFS_ZERO;
  }
  if (colortype == LCT_PALETTE) {
    LVar16 = LFS_ZERO;
  }
  if (settings->filter_palette_zero == 0) {
    LVar16 = settings->filter_strategy;
  }
  if (uVar4 == 0) {
    return 0x1f;
  }
  lVar9 = (ulong)(w >> 3) * (ulong)uVar4;
  uVar6 = (ulong)((w & 7) * uVar4 + 7 >> 3);
  length = lVar9 + uVar6;
  lVar9 = lVar9 + uVar6 + 1;
  uVar6 = (ulong)(uVar4 + 7 >> 3);
  if (LVar16 < LFS_MINSUM) {
    if (h != 0) {
      uVar22 = (ulong)h;
      puVar20 = out + 1;
      puVar17 = (uchar *)0x0;
      do {
        puVar8 = in;
        puVar20[-1] = (uchar)LVar16;
        filterScanline(puVar20,puVar8,puVar17,length,uVar6,(uchar)LVar16);
        puVar20 = puVar20 + lVar9;
        uVar22 = uVar22 - 1;
        in = puVar8 + length;
        puVar17 = puVar8;
      } while (uVar22 != 0);
    }
LAB_001cf3b2:
    uVar5 = 0;
  }
  else {
    switch(LVar16) {
    case LFS_MINSUM:
      lVar15 = 0;
      uVar5 = 0;
      do {
        pvVar7 = malloc(length);
        *(void **)(&local_438[0].btype + lVar15 * 2) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          uVar5 = 0x53;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 5);
      if (h != 0 && uVar5 == 0) {
        uVar10 = 0;
        local_4f8 = (uchar *)0x0;
        uVar4 = 0;
        uVar22 = 0;
        puVar17 = out;
        do {
          lVar15 = length * uVar10;
          lVar23 = 0;
          do {
            puVar20 = *(uchar **)(&local_438[0].btype + lVar23 * 2);
            filterScanline(puVar20,in + lVar15,local_4f8,length,uVar6,(uchar)lVar23);
            if (lVar23 == 0) {
              if (length == 0) goto LAB_001cf4d3;
              uVar13 = 0;
              uVar21 = 0;
              do {
                uVar21 = uVar21 + puVar20[uVar13];
                uVar13 = uVar13 + 1;
              } while (length != (uVar13 & 0xffffffff));
            }
            else if (length == 0) {
LAB_001cf4d3:
              uVar21 = 0;
            }
            else {
              uVar13 = 0;
              uVar21 = 0;
              do {
                bVar1 = puVar20[uVar13];
                uVar19 = bVar1 ^ 0xff;
                if (-1 < (char)bVar1) {
                  uVar19 = (uint)bVar1;
                }
                uVar21 = uVar21 + uVar19;
                uVar13 = uVar13 + 1;
              } while (length != (uVar13 & 0xffffffff));
            }
            bVar24 = uVar21 < uVar22;
            if (bVar24 || lVar23 == 0) {
              uVar22 = uVar21;
            }
            uVar4 = uVar4 & 0xff;
            if (bVar24 || lVar23 == 0) {
              uVar4 = (uint)lVar23;
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != 5);
          out[lVar9 * uVar10] = (uchar)uVar4;
          if (length != 0) {
            lVar23 = *(long *)(&local_438[0].btype + (ulong)(uVar4 & 0xff) * 2);
            uVar21 = 1;
            do {
              puVar17[uVar21] = *(uchar *)(lVar23 + -1 + uVar21);
              uVar13 = uVar21 & 0xffffffff;
              uVar21 = uVar21 + 1;
            } while (length != uVar13);
          }
          uVar10 = uVar10 + 1;
          puVar17 = puVar17 + lVar9;
          local_4f8 = in + lVar15;
        } while (uVar10 != h);
      }
      lVar9 = 0;
      do {
        free(*(void **)(&local_438[0].btype + lVar9 * 2));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      break;
    case LFS_ENTROPY:
      lVar15 = 0;
      uVar5 = 0;
      do {
        pvVar7 = malloc(length);
        auStack_498[lVar15] = (ulong)pvVar7;
        if (pvVar7 == (void *)0x0) {
          uVar5 = 0x53;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 5);
      if (h != 0 && uVar5 == 0) {
        uVar10 = 0;
        local_4f8 = (uchar *)0x0;
        uVar4 = 0;
        uVar22 = 0;
        puVar17 = out;
        do {
          lVar15 = length * uVar10;
          lVar23 = 0;
          do {
            puVar20 = (uchar *)auStack_498[lVar23];
            filterScanline(puVar20,in + lVar15,local_4f8,length,uVar6,(uchar)lVar23);
            memset(local_438,0,0x400);
            if (length != 0) {
              uVar21 = 0;
              do {
                (&local_438[0].btype)[puVar20[uVar21]] = (&local_438[0].btype)[puVar20[uVar21]] + 1;
                uVar21 = uVar21 + 1;
              } while (length != (uVar21 & 0xffffffff));
            }
            (&local_438[0].btype)[lVar23] = (&local_438[0].btype)[lVar23] + 1;
            lVar14 = 0;
            uVar21 = 0;
            do {
              uVar19 = (&local_438[0].btype)[lVar14];
              uVar13 = (ulong)uVar19;
              if (uVar13 == 0) {
                lVar12 = 0;
              }
              else {
                uVar11 = (ulong)(uVar19 >> 0x10);
                if (0xffff >= uVar19) {
                  uVar11 = uVar13;
                }
                lVar18 = (ulong)(0xffff < uVar19) * 0x10;
                lVar12 = lVar18 + 8;
                uVar3 = uVar11 >> 8;
                if (uVar11 < 0x100) {
                  lVar12 = lVar18;
                  uVar3 = uVar11;
                }
                lVar18 = lVar12 + 4;
                uVar11 = uVar3 >> 4;
                if (uVar3 < 0x10) {
                  lVar18 = lVar12;
                  uVar11 = uVar3;
                }
                uVar19 = (uint)(uVar11 >> 2);
                lVar12 = lVar18 + 2;
                if (uVar11 < 4) {
                  uVar19 = (uint)uVar11;
                  lVar12 = lVar18;
                }
                lVar12 = (lVar12 + 1) - (ulong)(uVar19 < 2);
                lVar12 = lVar12 * uVar13 + (uVar13 - (uint)(1 << ((byte)lVar12 & 0x1f))) * 2;
              }
              uVar21 = uVar21 + lVar12;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x100);
            bVar24 = uVar22 < uVar21;
            if (bVar24 || lVar23 == 0) {
              uVar22 = uVar21;
            }
            if (bVar24 || lVar23 == 0) {
              uVar4 = (uint)lVar23;
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != 5);
          out[lVar9 * uVar10] = (uchar)uVar4;
          if (length != 0) {
            uVar21 = auStack_498[uVar4];
            uVar13 = 1;
            do {
              puVar17[uVar13] = *(uchar *)((uVar21 - 1) + uVar13);
              uVar11 = uVar13 & 0xffffffff;
              uVar13 = uVar13 + 1;
            } while (length != uVar11);
          }
          uVar10 = uVar10 + 1;
          puVar17 = puVar17 + lVar9;
          local_4f8 = in + lVar15;
        } while (uVar10 != h);
      }
      lVar9 = 0;
      do {
        free((void *)auStack_498[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      break;
    case LFS_BRUTE_FORCE:
      uVar2 = (settings->zlibsettings).use_lz77;
      local_438[0].windowsize = (settings->zlibsettings).windowsize;
      local_438[0].minmatch = (settings->zlibsettings).minmatch;
      local_438[0].nicematch = (settings->zlibsettings).nicematch;
      local_438[0].lazymatching = (settings->zlibsettings).lazymatching;
      local_438[0].custom_context = (settings->zlibsettings).custom_context;
      local_438[0].use_lz77 = uVar2;
      local_438[0].btype = 1;
      local_438[0].custom_zlib =
           (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
      local_438[0].custom_deflate =
           (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
      lVar15 = 0;
      uVar5 = 0;
      do {
        pvVar7 = malloc(length);
        alStack_468[lVar15] = (long)pvVar7;
        if (pvVar7 == (void *)0x0) {
          uVar5 = 0x53;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 5);
      if (h != 0 && uVar5 == 0) {
        local_4a8 = (ulong)h;
        uVar10 = 0;
        local_4e0 = 0;
        uVar22 = 0;
        local_4f8 = (uchar *)0x0;
        puVar17 = out;
        do {
          lVar15 = length * uVar10;
          lVar23 = 0;
          uVar21 = 0;
          local_4a0 = uVar10;
          do {
            puVar20 = (uchar *)alStack_468[uVar21];
            filterScanline(puVar20,in + lVar15,local_4f8,length,uVar6,(uchar)uVar21);
            auStack_498[uVar21] = 0;
            local_4b0 = (uchar *)0x0;
            zlib_compress(&local_4b0,(size_t *)((long)auStack_498 + lVar23),puVar20,
                          length & 0xffffffff,local_438);
            free(local_4b0);
            if ((uVar21 == 0) || (auStack_498[uVar21] < uVar22)) {
              uVar22 = auStack_498[uVar21];
              local_4e0 = uVar21 & 0xffffffff;
            }
            uVar21 = uVar21 + 1;
            lVar23 = lVar23 + 8;
          } while (uVar21 != 5);
          out[lVar9 * local_4a0] = (uchar)local_4e0;
          if (length != 0) {
            lVar23 = alStack_468[local_4e0];
            uVar10 = 1;
            do {
              puVar17[uVar10] = *(uchar *)(lVar23 + -1 + uVar10);
              uVar21 = uVar10 & 0xffffffff;
              uVar10 = uVar10 + 1;
            } while (length != uVar21);
          }
          uVar10 = local_4a0 + 1;
          puVar17 = puVar17 + lVar9;
          local_4f8 = in + lVar15;
        } while (uVar10 != local_4a8);
      }
      lVar9 = 0;
      do {
        free((void *)alStack_468[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      break;
    case LFS_PREDEFINED:
      if (h != 0) {
        puVar20 = out + 1;
        uVar22 = 0;
        puVar17 = (uchar *)0x0;
        do {
          puVar8 = in;
          filterType = settings->predefined_filters[uVar22];
          puVar20[-1] = filterType;
          filterScanline(puVar20,puVar8,puVar17,length,uVar6,filterType);
          uVar22 = uVar22 + 1;
          puVar20 = puVar20 + lVar9;
          in = puVar8 + length;
          puVar17 = puVar8;
        } while (h != uVar22);
      }
      goto LAB_001cf3b2;
    default:
      uVar5 = 0x58;
    }
  }
  return uVar5;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* color, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(color);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (color->colortype == LCT_PALETTE || color->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum < smallest) {
            bestType = type;
            smallest = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          lodepng_memset(count, 0, 256 * sizeof(*count));
          for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
          ++count[type]; /*the filter type itself is part of the scanline*/
          for(x = 0; x != 256; ++x) {
            sum += ilog2i(count[x]);
          }
          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum > bestSum) {
            bestType = type;
            bestSum = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings;
    lodepng_memcpy(&zlibsettings, &settings->zlibsettings, sizeof(LodePNGCompressSettings));
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }
    if(!error) {
      for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
        for(type = 0; type != 5; ++type) {
          unsigned testsize = (unsigned)linebytes;
          /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          size[type] = 0;
          dummy = 0;
          zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
          lodepng_free(dummy);
          /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || size[type] < smallest) {
            bestType = type;
            smallest = size[type];
          }
        }
        prevline = &in[y * linebytes];
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}